

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

ostream * despot::operator<<(ostream *os,vector<despot::State,_std::allocator<despot::State>_> *vec)

{
  size_type sVar1;
  ostream *os_00;
  reference state;
  char *pcVar2;
  int local_1c;
  int i;
  vector<despot::State,_std::allocator<despot::State>_> *vec_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<despot::State,_std::allocator<despot::State>_>::size(vec);
    if (sVar1 <= (ulong)(long)local_1c) break;
    pcVar2 = ", ";
    if (local_1c == 0) {
      pcVar2 = "";
    }
    os_00 = std::operator<<(os,pcVar2);
    state = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                      (vec,(long)local_1c);
    operator<<(os_00,state);
    local_1c = local_1c + 1;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}